

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadServiceWrapperBase.cpp
# Opt level: O2

bool __thiscall
ThreadServiceWrapperBase::ScheduleIdleCollect
          (ThreadServiceWrapperBase *this,uint ticks,bool scheduleAsTask)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  DWORD DVar5;
  undefined4 *puVar6;
  
  if (this->threadContext->callRootLevel != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadServiceWrapperBase.cpp"
                       ,0x2b,"(!threadContext->IsInScript())","!threadContext->IsInScript()");
    if (!bVar2) goto LAB_00728405;
    *puVar6 = 0;
  }
  if (((this->needIdleCollect == false) && (this->shouldScheduleIdleCollectOnExitIdle == false)) &&
     (BVar3 = Memory::Recycler::CollectionInProgress(this->threadContext->recycler), BVar3 == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadServiceWrapperBase.cpp"
                       ,0x33,
                       "(needIdleCollect || shouldScheduleIdleCollectOnExitIdle || threadContext->GetRecycler()->CollectionInProgress())"
                       ,
                       "needIdleCollect || shouldScheduleIdleCollectOnExitIdle || threadContext->GetRecycler()->CollectionInProgress()"
                      );
    if (!bVar2) {
LAB_00728405:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  iVar4 = (*(this->super_ThreadServiceWrapper)._vptr_ThreadServiceWrapper[3])(this);
  if ((char)iVar4 != '\0') {
    if (this->hasScheduledIdleCollect != false) {
      return true;
    }
    iVar4 = (*(this->super_ThreadServiceWrapper)._vptr_ThreadServiceWrapper[4])
                      (this,(ulong)ticks,(ulong)scheduleAsTask);
    if ((char)iVar4 != '\0') {
      if ((DAT_0145948a == '\x01') &&
         (bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,IdleCollectPhase), bVar2)) {
        DVar5 = GetCurrentThreadId();
        Output::Print(L"%04X> ScheduledIdleCollect- Set hasScheduledIdleCollect\n",(ulong)DVar5);
        Output::Flush();
      }
      this->hasScheduledIdleCollect = true;
      return true;
    }
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,IdleCollectPhase);
    if (bVar2) {
      DVar5 = GetCurrentThreadId();
      Output::Print(L"%04X> Idle timer setup failed\n",(ulong)DVar5);
      Output::Flush();
    }
    FinishIdleCollect(this,FinishReasonIdleTimerSetupFailed);
  }
  return false;
}

Assistant:

bool ThreadServiceWrapperBase::ScheduleIdleCollect(uint ticks, bool scheduleAsTask)
{
    Assert(!threadContext->IsInScript());

    // We should schedule have called this in one of two cases:
    //  1) Either needIdleCollect is true- in which case, we should schedule one
    //  2) Or ScheduleNextCollectionOnExit was called when needIdleCollect was true, but we didn't schedule
    //      one because we were at the time in one. Later, as we unwound, we might have set needIdleCollect to false
    //      but because we had noted that we needed to schedule a collect, we would end up coming into this function
    //      so allow for that
    Assert(needIdleCollect || shouldScheduleIdleCollectOnExitIdle || threadContext->GetRecycler()->CollectionInProgress());

    if (!CanScheduleIdleCollect())
    {
        return false;
    }

    if (hasScheduledIdleCollect)
    {
        return true;
    }

    if (OnScheduleIdleCollect(ticks, scheduleAsTask))
    {
        JS_ETW(EventWriteJSCRIPT_GC_IDLE_START(this));
        IDLE_COLLECT_VERBOSE_TRACE(_u("ScheduledIdleCollect- Set hasScheduledIdleCollect\n"));

        hasScheduledIdleCollect = true;
        return true;
    }
    else
    {
        IDLE_COLLECT_TRACE(_u("Idle timer setup failed\n"));
        FinishIdleCollect(FinishReason::FinishReasonIdleTimerSetupFailed);
        return false;
    }
}